

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bstricmp(bstring b0,bstring b1)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  byte bVar7;
  __int32_t **pp_Var8;
  uchar uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  
  if (b0 == (bstring)0x0) {
    return -0x8000;
  }
  puVar5 = b0->data;
  if (puVar5 == (uchar *)0x0) {
    return -0x8000;
  }
  uVar3 = b0->slen;
  if (b1 == (bstring)0x0 || (int)uVar3 < 0) {
    return -0x8000;
  }
  puVar6 = b1->data;
  if (puVar6 != (uchar *)0x0) {
    uVar4 = b1->slen;
    if ((int)uVar4 < 0) {
      return -0x8000;
    }
    uVar11 = uVar4;
    if ((uVar4 < uVar3) || (uVar11 = uVar3, puVar5 != puVar6 || uVar3 != uVar4)) {
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          bVar1 = puVar5[uVar12];
          bVar10 = bVar1;
          if (-1 < (long)(char)bVar1) {
            pp_Var8 = __ctype_tolower_loc();
            bVar10 = *(byte *)(*pp_Var8 + (char)bVar1);
          }
          bVar2 = puVar6[uVar12];
          bVar7 = bVar2;
          if (-1 < (long)(char)bVar2) {
            pp_Var8 = __ctype_tolower_loc();
            bVar7 = *(byte *)(*pp_Var8 + (char)bVar2);
          }
          if (bVar10 != bVar7) {
            return (uint)bVar1 - (uint)bVar2;
          }
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      if ((int)uVar11 < (int)uVar3) {
        uVar9 = puVar5[uVar11];
        if (-1 < (long)(char)uVar9) {
          pp_Var8 = __ctype_tolower_loc();
          uVar9 = (uchar)(*pp_Var8)[(char)uVar9];
        }
        if (uVar9 == '\0') {
          return 0x100;
        }
        return (int)(char)uVar9;
      }
      if ((int)uVar11 < (int)uVar4) {
        uVar9 = puVar6[uVar11];
        if (-1 < (long)(char)uVar9) {
          pp_Var8 = __ctype_tolower_loc();
          uVar9 = (uchar)(*pp_Var8)[(char)uVar9];
          if (uVar9 == '\0') {
            return -0x100;
          }
        }
        return -(int)(char)uVar9;
      }
    }
    return 0;
  }
  return -0x8000;
}

Assistant:

int bstricmp (const bstring b0, const bstring b1) {
int i, v, n;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0) return SHRT_MIN;
	if ((n = b0->slen) > b1->slen) n = b1->slen;
	else if (b0->slen == b1->slen && b0->data == b1->data) return 0;

	for (i = 0; i < n; i ++) {
		v  = (char) downcase (b0->data[i]);
		v -= (char) downcase (b1->data[i]);
		if (v != 0) return b0->data[i] - b1->data[i];
	}

	if (b0->slen > n) {
		v = (char) downcase (b0->data[n]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}
	if (b1->slen > n) {
		v = - (char) downcase (b1->data[n]);
		if (v) return v;
		return - (int) (UCHAR_MAX + 1);
	}
	return 0;
}